

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O1

void png_do_expand(png_row_infop row_info,png_bytep row,png_const_color_16p trans_color)

{
  png_byte *ppVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  png_uint_16 pVar5;
  png_uint_16 pVar6;
  byte bVar7;
  png_bytep ppVar8;
  png_size_t pVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  png_byte *ppVar13;
  png_uint_16 pVar14;
  byte *pbVar15;
  byte *pbVar16;
  uint uVar17;
  png_byte pVar18;
  uint uVar19;
  bool bVar20;
  
  uVar17 = row_info->width;
  uVar10 = (ulong)uVar17;
  if (row_info->color_type == '\0') {
    if (trans_color == (png_const_color_16p)0x0) {
      pVar14 = 0;
    }
    else {
      pVar14 = trans_color->gray;
    }
    bVar7 = row_info->bit_depth;
    if (bVar7 < 8) {
      if (bVar7 == 4) {
        pVar14 = (pVar14 & 0xf) << 4 | pVar14 & 0xf;
        if (uVar17 != 0) {
          uVar11 = uVar17 * 4 & 4;
          pbVar16 = row + (uVar17 - 1 >> 1);
          pbVar15 = row + uVar10;
          uVar12 = uVar10;
          do {
            pbVar15 = pbVar15 + -1;
            bVar7 = *pbVar16 >> (sbyte)uVar11;
            *pbVar15 = bVar7 << 4 | bVar7 & 0xf;
            pbVar16 = pbVar16 + -(ulong)(uVar11 != 0);
            uVar11 = (uint)(uVar11 == 0) << 2;
            uVar19 = (int)uVar12 - 1;
            uVar12 = (ulong)uVar19;
          } while (uVar19 != 0);
        }
      }
      else if (bVar7 == 2) {
        pVar14 = (pVar14 & 3) * 0x55;
        if (uVar17 != 0) {
          uVar11 = ~(uVar17 * 2 + 6) & 6;
          pbVar15 = row + (uVar17 - 1 >> 2);
          ppVar8 = row + uVar10;
          uVar12 = uVar10;
          do {
            ppVar8 = ppVar8 + -1;
            *ppVar8 = (*pbVar15 >> ((byte)uVar11 & 0x1f) & 3) * 'U';
            bVar20 = uVar11 == 6;
            uVar11 = uVar11 + 2;
            if (bVar20) {
              uVar11 = 0;
            }
            pbVar15 = pbVar15 + -(ulong)bVar20;
            uVar19 = (int)uVar12 - 1;
            uVar12 = (ulong)uVar19;
          } while (uVar19 != 0);
        }
      }
      else if (bVar7 == 1) {
        uVar2 = pVar14 & 1;
        pVar14 = 0xff;
        if (uVar2 == 0) {
          pVar14 = 0;
        }
        if (uVar17 != 0) {
          uVar11 = -uVar17 & 7;
          pbVar15 = row + (uVar17 - 1 >> 3);
          ppVar8 = row + uVar10;
          uVar12 = uVar10;
          do {
            ppVar8 = ppVar8 + -1;
            *ppVar8 = -((*pbVar15 >> (uVar11 & 0x1f) & 1) != 0);
            bVar20 = uVar11 == 7;
            uVar11 = uVar11 + 1;
            if (bVar20) {
              uVar11 = 0;
            }
            pbVar15 = pbVar15 + -(ulong)bVar20;
            uVar19 = (int)uVar12 - 1;
            uVar12 = (ulong)uVar19;
          } while (uVar19 != 0);
        }
      }
      row_info->bit_depth = '\b';
      row_info->pixel_depth = '\b';
      row_info->rowbytes = uVar10;
    }
    if (trans_color == (png_const_color_16p)0x0) {
      return;
    }
    if (row_info->bit_depth == '\x10') {
      if (uVar17 != 0) {
        pVar9 = row_info->rowbytes;
        uVar12 = uVar10;
        do {
          if ((row[pVar9 - 2] == (png_byte)(pVar14 >> 8)) && (row[pVar9 - 1] == (png_byte)pVar14)) {
            pVar18 = '\0';
          }
          else {
            pVar18 = 0xff;
          }
          row[pVar9 * 2 + -1] = pVar18;
          row[pVar9 * 2 + -2] = pVar18;
          row[pVar9 * 2 + -3] = row[pVar9 - 1];
          row[pVar9 * 2 + -4] = row[pVar9 - 2];
          pVar9 = pVar9 - 2;
          uVar17 = (int)uVar12 - 1;
          uVar12 = (ulong)uVar17;
        } while (uVar17 != 0);
      }
    }
    else {
      uVar12 = uVar10;
      if (row_info->bit_depth == '\b') {
        while (uVar17 != 0) {
          row[uVar12 * 2 + -1] = -(row[uVar12 - 1] != (png_byte)pVar14);
          row[uVar12 * 2 + -2] = row[uVar12 - 1];
          uVar17 = (uint)(uVar12 - 1);
          uVar12 = uVar12 - 1;
        }
      }
    }
    row_info->color_type = '\x04';
    row_info->channels = '\x02';
    bVar7 = row_info->bit_depth * '\x02';
  }
  else {
    if (trans_color == (png_const_color_16p)0x0 || row_info->color_type != '\x02') {
      return;
    }
    if (row_info->bit_depth == '\x10') {
      if (uVar17 != 0) {
        uVar2 = trans_color->red;
        uVar3 = trans_color->green;
        uVar4 = trans_color->blue;
        ppVar8 = row + uVar10 * 8 + -1;
        ppVar13 = row + (row_info->rowbytes - 1);
        uVar12 = uVar10;
        do {
          if ((((uVar2 >> 8 == (ushort)ppVar13[-5]) && (ppVar13[-4] == (png_byte)uVar2)) &&
              (uVar3 >> 8 == (ushort)ppVar13[-3])) &&
             (((ppVar13[-2] == (png_byte)uVar3 && (uVar4 >> 8 == (ushort)ppVar13[-1])) &&
              (*ppVar13 == (png_byte)uVar4)))) {
            pVar18 = '\0';
          }
          else {
            pVar18 = 0xff;
          }
          *ppVar8 = pVar18;
          ppVar8[-1] = pVar18;
          ppVar8[-2] = *ppVar13;
          ppVar8[-3] = ppVar13[-1];
          ppVar8[-4] = ppVar13[-2];
          ppVar8[-5] = ppVar13[-3];
          ppVar8[-6] = ppVar13[-4];
          ppVar1 = ppVar13 + -5;
          ppVar13 = ppVar13 + -6;
          ppVar8[-7] = *ppVar1;
          ppVar8 = ppVar8 + -8;
          uVar17 = (int)uVar12 - 1;
          uVar12 = (ulong)uVar17;
        } while (uVar17 != 0);
      }
    }
    else if ((row_info->bit_depth == '\b') && (uVar17 != 0)) {
      ppVar8 = row + uVar10 * 4 + -1;
      ppVar13 = row + (row_info->rowbytes - 1);
      pVar14 = trans_color->blue;
      pVar5 = trans_color->red;
      pVar6 = trans_color->green;
      uVar12 = uVar10;
      do {
        if (((ppVar13[-2] == (png_byte)pVar5) && (ppVar13[-1] == (png_byte)pVar6)) &&
           (*ppVar13 == (png_byte)pVar14)) {
          pVar18 = '\0';
        }
        else {
          pVar18 = 0xff;
        }
        *ppVar8 = pVar18;
        ppVar8[-1] = *ppVar13;
        ppVar8[-2] = ppVar13[-1];
        ppVar1 = ppVar13 + -2;
        ppVar13 = ppVar13 + -3;
        ppVar8[-3] = *ppVar1;
        ppVar8 = ppVar8 + -4;
        uVar17 = (int)uVar12 - 1;
        uVar12 = (ulong)uVar17;
      } while (uVar17 != 0);
    }
    row_info->color_type = '\x06';
    row_info->channels = '\x04';
    bVar7 = row_info->bit_depth << 2;
  }
  row_info->pixel_depth = bVar7;
  if (bVar7 < 8) {
    uVar10 = bVar7 * uVar10 + 7 >> 3;
  }
  else {
    uVar10 = (bVar7 >> 3) * uVar10;
  }
  row_info->rowbytes = uVar10;
  return;
}

Assistant:

static void
png_do_expand(png_row_infop row_info, png_bytep row,
    png_const_color_16p trans_color)
{
   int shift, value;
   png_bytep sp, dp;
   png_uint_32 i;
   png_uint_32 row_width=row_info->width;

   png_debug(1, "in png_do_expand");

   {
      if (row_info->color_type == PNG_COLOR_TYPE_GRAY)
      {
         unsigned int gray = trans_color != NULL ? trans_color->gray : 0;

         if (row_info->bit_depth < 8)
         {
            switch (row_info->bit_depth)
            {
               case 1:
               {
                  gray = (gray & 0x01) * 0xff;
                  sp = row + (png_size_t)((row_width - 1) >> 3);
                  dp = row + (png_size_t)row_width - 1;
                  shift = 7 - (int)((row_width + 7) & 0x07);
                  for (i = 0; i < row_width; i++)
                  {
                     if ((*sp >> shift) & 0x01)
                        *dp = 0xff;

                     else
                        *dp = 0;

                     if (shift == 7)
                     {
                        shift = 0;
                        sp--;
                     }

                     else
                        shift++;

                     dp--;
                  }
                  break;
               }

               case 2:
               {
                  gray = (gray & 0x03) * 0x55;
                  sp = row + (png_size_t)((row_width - 1) >> 2);
                  dp = row + (png_size_t)row_width - 1;
                  shift = (int)((3 - ((row_width + 3) & 0x03)) << 1);
                  for (i = 0; i < row_width; i++)
                  {
                     value = (*sp >> shift) & 0x03;
                     *dp = (png_byte)(value | (value << 2) | (value << 4) |
                        (value << 6));
                     if (shift == 6)
                     {
                        shift = 0;
                        sp--;
                     }

                     else
                        shift += 2;

                     dp--;
                  }
                  break;
               }

               case 4:
               {
                  gray = (gray & 0x0f) * 0x11;
                  sp = row + (png_size_t)((row_width - 1) >> 1);
                  dp = row + (png_size_t)row_width - 1;
                  shift = (int)((1 - ((row_width + 1) & 0x01)) << 2);
                  for (i = 0; i < row_width; i++)
                  {
                     value = (*sp >> shift) & 0x0f;
                     *dp = (png_byte)(value | (value << 4));
                     if (shift == 4)
                     {
                        shift = 0;
                        sp--;
                     }

                     else
                        shift = 4;

                     dp--;
                  }
                  break;
               }

               default:
                  break;
            }

            row_info->bit_depth = 8;
            row_info->pixel_depth = 8;
            row_info->rowbytes = row_width;
         }

         if (trans_color != NULL)
         {
            if (row_info->bit_depth == 8)
            {
               gray = gray & 0xff;
               sp = row + (png_size_t)row_width - 1;
               dp = row + ((png_size_t)row_width << 1) - 1;

               for (i = 0; i < row_width; i++)
               {
                  if ((*sp & 0xffU) == gray)
                     *dp-- = 0;

                  else
                     *dp-- = 0xff;

                  *dp-- = *sp--;
               }
            }

            else if (row_info->bit_depth == 16)
            {
               unsigned int gray_high = (gray >> 8) & 0xff;
               unsigned int gray_low = gray & 0xff;
               sp = row + row_info->rowbytes - 1;
               dp = row + (row_info->rowbytes << 1) - 1;
               for (i = 0; i < row_width; i++)
               {
                  if ((*(sp - 1) & 0xffU) == gray_high &&
                      (*(sp) & 0xffU) == gray_low)
                  {
                     *dp-- = 0;
                     *dp-- = 0;
                  }

                  else
                  {
                     *dp-- = 0xff;
                     *dp-- = 0xff;
                  }

                  *dp-- = *sp--;
                  *dp-- = *sp--;
               }
            }

            row_info->color_type = PNG_COLOR_TYPE_GRAY_ALPHA;
            row_info->channels = 2;
            row_info->pixel_depth = (png_byte)(row_info->bit_depth << 1);
            row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth,
                row_width);
         }
      }
      else if (row_info->color_type == PNG_COLOR_TYPE_RGB &&
          trans_color != NULL)
      {
         if (row_info->bit_depth == 8)
         {
            png_byte red = (png_byte)(trans_color->red & 0xff);
            png_byte green = (png_byte)(trans_color->green & 0xff);
            png_byte blue = (png_byte)(trans_color->blue & 0xff);
            sp = row + (png_size_t)row_info->rowbytes - 1;
            dp = row + ((png_size_t)row_width << 2) - 1;
            for (i = 0; i < row_width; i++)
            {
               if (*(sp - 2) == red && *(sp - 1) == green && *(sp) == blue)
                  *dp-- = 0;

               else
                  *dp-- = 0xff;

               *dp-- = *sp--;
               *dp-- = *sp--;
               *dp-- = *sp--;
            }
         }
         else if (row_info->bit_depth == 16)
         {
            png_byte red_high = (png_byte)((trans_color->red >> 8) & 0xff);
            png_byte green_high = (png_byte)((trans_color->green >> 8) & 0xff);
            png_byte blue_high = (png_byte)((trans_color->blue >> 8) & 0xff);
            png_byte red_low = (png_byte)(trans_color->red & 0xff);
            png_byte green_low = (png_byte)(trans_color->green & 0xff);
            png_byte blue_low = (png_byte)(trans_color->blue & 0xff);
            sp = row + row_info->rowbytes - 1;
            dp = row + ((png_size_t)row_width << 3) - 1;
            for (i = 0; i < row_width; i++)
            {
               if (*(sp - 5) == red_high &&
                   *(sp - 4) == red_low &&
                   *(sp - 3) == green_high &&
                   *(sp - 2) == green_low &&
                   *(sp - 1) == blue_high &&
                   *(sp    ) == blue_low)
               {
                  *dp-- = 0;
                  *dp-- = 0;
               }

               else
               {
                  *dp-- = 0xff;
                  *dp-- = 0xff;
               }

               *dp-- = *sp--;
               *dp-- = *sp--;
               *dp-- = *sp--;
               *dp-- = *sp--;
               *dp-- = *sp--;
               *dp-- = *sp--;
            }
         }
         row_info->color_type = PNG_COLOR_TYPE_RGB_ALPHA;
         row_info->channels = 4;
         row_info->pixel_depth = (png_byte)(row_info->bit_depth << 2);
         row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth, row_width);
      }
   }
}